

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O1

void Mpm_ManPrecomputePerms(Mpm_Man_t *p)

{
  char (*pacVar1) [6];
  char cVar2;
  undefined8 *puVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int *__ptr;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  void *pvVar11;
  Vec_Wrd_t *pVVar12;
  word *pwVar13;
  Hsh_IntMan_t *pHVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  char (*pacVar23) [6];
  uint uVar24;
  ulong uVar25;
  word Entry;
  bool bVar26;
  timespec ts;
  timespec local_68;
  long local_58;
  int *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  uVar6 = Extra_Factorial(6);
  iVar7 = clock_gettime(3,&local_68);
  if (iVar7 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (p->pDsd6 != (Mpm_Dsd_t *)0x0) {
    __assert_fail("p->pDsd6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x2fe,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  p->pDsd6 = s_DsdClass6;
  local_50 = Extra_GreyCodeSchedule(6);
  __ptr = Extra_PermSchedule(6);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x40000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x100000);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = 0x40000;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0xff,0x100000);
  }
  p->vMap2Perm = pVVar8;
  lVar10 = 0;
  do {
    p->Perm6[0][lVar10] = (char)lVar10;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if (0 < (int)uVar6) {
    pacVar1 = p->Perm6;
    uVar19 = 0x2c688;
    uVar22 = 0;
    pacVar23 = pacVar1;
    do {
      if (uVar22 != 0) {
        lVar10 = -6;
        do {
          pacVar23[1][lVar10] = (*pacVar23)[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
      }
      lVar10 = (long)__ptr[uVar22];
      cVar2 = pacVar1[uVar22][lVar10];
      pacVar1[uVar22][lVar10] = pacVar1[uVar22][lVar10 + 1];
      pacVar1[uVar22][(long)__ptr[uVar22] + 1] = cVar2;
      bVar15 = (char)__ptr[uVar22] * '\x03';
      uVar24 = ((int)uVar19 >> (bVar15 + 3 & 0x1f) ^ (int)uVar19 >> (bVar15 & 0x1f)) & 7;
      uVar19 = uVar19 ^ uVar24 << (bVar15 + 3 & 0x1f) ^ uVar24 << (bVar15 & 0x1f);
      if (((int)uVar19 < 0) || (p->vMap2Perm->nSize <= (int)uVar19)) goto LAB_008c8995;
      p->vMap2Perm->pArray[uVar19] = (int)uVar22;
      uVar22 = uVar22 + 1;
      pacVar23 = pacVar23 + 1;
    } while (uVar22 != uVar6);
    if (uVar19 != 0x2c688) {
      __assert_fail("OneCopy == One",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,800,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
  }
  local_48 = (ulong)uVar6;
  piVar9 = (int *)malloc(0x10);
  piVar9[0] = 0x10;
  piVar9[1] = 0;
  pvVar11 = malloc(0x40);
  *(void **)(piVar9 + 2) = pvVar11;
  if (0 < p->vMap2Perm->nSize) {
    iVar7 = *piVar9;
    uVar22 = 0;
    do {
      iVar16 = iVar7;
      if (iVar7 < 6) {
        if (*(void **)(piVar9 + 2) == (void *)0x0) {
          pvVar11 = malloc(0x18);
        }
        else {
          pvVar11 = realloc(*(void **)(piVar9 + 2),0x18);
        }
        *(void **)(piVar9 + 2) = pvVar11;
        iVar16 = 6;
        if (pvVar11 == (void *)0x0) {
          *piVar9 = iVar7;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
      }
      iVar7 = iVar16;
      puVar3 = *(undefined8 **)(piVar9 + 2);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = 0;
      piVar9[1] = 6;
      bVar26 = true;
      bVar15 = 0;
      iVar16 = 0;
      uVar19 = 0;
      do {
        uVar24 = (uint)uVar22 >> (bVar15 & 0x1f) & 7;
        bVar5 = false;
        if (5 < uVar24) {
          if (uVar24 != 6) goto LAB_008c8671;
        }
        else {
          if (5 < uVar24) goto LAB_008c896e;
          if (*(int *)((long)puVar3 + (ulong)uVar24 * 4) == 1) {
            bVar5 = false;
          }
          else {
            *(undefined4 *)((long)puVar3 + (ulong)uVar24 * 4) = 1;
            iVar16 = iVar16 + 1;
LAB_008c8671:
            bVar5 = true;
          }
        }
        if (!bVar5) break;
        bVar26 = uVar19 < 5;
        uVar19 = uVar19 + 1;
        bVar15 = bVar15 + 3;
      } while (uVar19 != 6);
      if (iVar16 != 6 && !bVar26) {
        lVar10 = 0;
        uVar19 = 0;
        do {
          if (*(int *)((long)puVar3 + lVar10 * 4) == 0) {
            if (5 < uVar19) goto LAB_008c8991;
            uVar25 = (ulong)uVar19;
            uVar19 = uVar19 + 1;
            *(int *)((long)puVar3 + uVar25 * 4) = (int)lVar10;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 6);
        if (6 < (int)uVar19) {
          *piVar9 = iVar7;
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        piVar9[1] = uVar19;
        iVar16 = 0;
        uVar18 = uVar22 & 0xffffffff;
        uVar25 = 0;
        do {
          uVar21 = uVar25;
          if ((~((int)(uint)uVar18 >> ((byte)iVar16 & 0x1f)) & 7U) == 0) {
            iVar20 = (int)uVar25;
            if ((iVar20 < 0) || ((int)uVar19 <= iVar20)) goto LAB_008c896e;
            uVar21 = (ulong)(iVar20 + 1);
            uVar18 = (ulong)((uint)uVar18 ^
                            (*(uint *)((long)puVar3 + uVar25 * 4) ^ 7) << ((byte)iVar16 & 0x1f));
          }
          iVar16 = iVar16 + 3;
          uVar25 = uVar21;
        } while (iVar16 != 0x12);
        if ((uint)uVar21 != uVar19) {
          *piVar9 = iVar7;
          __assert_fail("x == Vec_IntSize(vVars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                        ,0x346,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
        }
        if ((int)uVar18 < 0) {
LAB_008c896e:
          *piVar9 = iVar7;
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar16 = p->vMap2Perm->nSize;
        if (iVar16 <= (int)uVar18) goto LAB_008c896e;
        piVar4 = p->vMap2Perm->pArray;
        iVar20 = piVar4[uVar18];
        if (iVar20 == -1) {
          *piVar9 = iVar7;
          __assert_fail("Vec_IntEntry( p->vMap2Perm, One ) != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                        ,0x348,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
        }
        if ((long)iVar16 <= (long)uVar22) {
LAB_008c8991:
          *piVar9 = iVar7;
LAB_008c8995:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4[uVar22] = iVar20;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)p->vMap2Perm->nSize);
    *piVar9 = iVar7;
  }
  if (*(void **)(piVar9 + 2) != (void *)0x0) {
    free(*(void **)(piVar9 + 2));
    piVar9[2] = 0;
    piVar9[3] = 0;
  }
  local_58 = lVar17;
  free(piVar9);
  if (p->vPerm6 != (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vPerm6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x355,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  pVVar12 = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < uVar6 * 0x253 - 1) {
    iVar7 = uVar6 * 0x253;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar13 = (word *)0x0;
  }
  else {
    pwVar13 = (word *)malloc((long)iVar7 << 3);
  }
  uVar22 = local_48;
  pVVar12->pArray = pwVar13;
  p->vPerm6 = pVVar12;
  lVar17 = 0;
  while( true ) {
    local_38 = lVar17 * 0x20;
    Entry = s_DsdClass6[lVar17].uTruth;
    local_40 = lVar17;
    if (0 < (int)uVar6) {
      uVar25 = 0;
      do {
        iVar7 = __ptr[uVar25];
        bVar15 = (byte)(1L << ((byte)iVar7 & 0x3f));
        Entry = (Entry & s_PMasks[iVar7][2]) >> (bVar15 & 0x3f) |
                (s_PMasks[iVar7][1] & Entry) << (bVar15 & 0x3f) | s_PMasks[iVar7][0] & Entry;
        Vec_WrdPush(p->vPerm6,Entry);
        uVar25 = uVar25 + 1;
      } while (uVar22 != uVar25);
    }
    if (Entry != *(word *)((long)&s_DsdClass6[0].uTruth + local_38)) break;
    lVar17 = local_40 + 1;
    if (lVar17 == 0x253) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (local_50 != (int *)0x0) {
        free(local_50);
      }
      pHVar14 = Mpm_ManBuildHashTable(&p->vConfgRes);
      p->pHash = pHVar14;
      iVar16 = 3;
      iVar7 = clock_gettime(3,&local_68);
      if (iVar7 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      lVar17 = lVar17 + local_58;
      Abc_Print(iVar16,"%s =","Setting up DSD information");
      Abc_Print(iVar16,"%9.2f sec\n",SUB84((double)lVar17 / 1000000.0,0));
      return;
    }
  }
  __assert_fail("uTruth == s_DsdClass6[i].uTruth",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                ,0x35f,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
}

Assistant:

void Mpm_ManPrecomputePerms( Mpm_Man_t * p )
{
    int nVars = 6;
    // 0(1:1) 1(2:1) 2(4:2) 3(10:6) 4(33:23) 5(131:98) 6(595:464)
    int nClasses[7] = { 1, 2, 4, 10, 33, 131, 595 };
    int nPerms = Extra_Factorial( nVars );
//    int nSwaps = (1 << nVars);
    int * pComp, * pPerm;
    int i, k, x, One, OneCopy, Num;
    Vec_Int_t * vVars;
    abctime clk = Abc_Clock();
    assert( p->pDsd6 == NULL );
    p->pDsd6 = s_DsdClass6;
    // precompute schedules
    pComp = Extra_GreyCodeSchedule( nVars );
    pPerm = Extra_PermSchedule( nVars );
    // map numbers into perms
    p->vMap2Perm = Vec_IntStartFull( (1<<(3*nVars)) );
    // store permutations
    One = 0;
    for ( x = 0; x < nVars; x++ )
    {
        p->Perm6[0][x] = (char)x;
        One |= (x << (3*x));
    }
//    Vec_IntWriteEntry( p->vMap2Perm, One, 0 );
    OneCopy = One;
    for ( k = 0; k < nPerms; k++ )
    {
        if ( k > 0 )
        for ( x = 0; x < nVars; x++ )
            p->Perm6[k][x] = p->Perm6[k-1][x];
        ABC_SWAP( char, p->Perm6[k][pPerm[k]], p->Perm6[k][pPerm[k]+1] );

        Num = ( (One >> (3*(pPerm[k]  ))) ^ (One >> (3*(pPerm[k]+1))) ) & 7;
        One ^=  (Num << (3*(pPerm[k]  )));
        One ^=  (Num << (3*(pPerm[k]+1)));

        Vec_IntWriteEntry( p->vMap2Perm, One, k );
        
//        Mpm_ManPrintPerm( One );
//        for ( x = 0; x < nVars; x++ )
//            printf( "%d ", p->Perm6[k][x] );
//        printf( "\n" );
    }
    assert( OneCopy == One );
    // fill in the gaps
    vVars = Vec_IntAlloc( 6 );
    Vec_IntForEachEntry( p->vMap2Perm, Num, i )
    {
        // mark used variables
        int Count = 0;
        One = i;
        Vec_IntFill( vVars, 6, 0 );
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar >= nVars && iVar < 7 )
                break;
            if ( iVar != 7 )
            {
                if ( Vec_IntEntry( vVars, iVar ) == 1 )
                    break;
                Vec_IntWriteEntry( vVars, iVar, 1 );
                Count++;
            }
        }
        // skip ones with dups and complete
        if ( k < nVars || Count == nVars )
            continue;
        // find unused variables
        for ( x = k = 0; k < 6; k++ )
            if ( Vec_IntEntry(vVars, k) == 0 )
                Vec_IntWriteEntry( vVars, x++, k );
        Vec_IntShrink( vVars, x );
        // fill in used variables
        x = 0;
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar == 7 )
                One ^= ((Vec_IntEntry(vVars, x++) ^ 7) << (3*k));
        }
        assert( x == Vec_IntSize(vVars) );
        // save this one
        assert( Vec_IntEntry( p->vMap2Perm, One ) != -1 );
        Vec_IntWriteEntry( p->vMap2Perm, i, Vec_IntEntry(p->vMap2Perm, One) );
/*
        // mapping
        Mpm_ManPrintPerm( i );
        printf( "->  " );
        Mpm_ManPrintPerm( One );
        printf( "\n" );
*/
    }
    Vec_IntFree( vVars );

    // store permuted truth tables
    assert( p->vPerm6 == NULL );
    p->vPerm6 = Vec_WrdAlloc( nPerms * 595 );
    for ( i = 0; i < nClasses[nVars]; i++ )
    {
        word uTruth = s_DsdClass6[i].uTruth;
        for ( k = 0; k < nPerms; k++ )
        {
            uTruth = Abc_Tt6SwapAdjacent( uTruth, pPerm[k] );
            Vec_WrdPush( p->vPerm6, uTruth );
        }
        assert( uTruth == s_DsdClass6[i].uTruth );
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // build hash table
    p->pHash = Mpm_ManBuildHashTable( &p->vConfgRes );
    Abc_PrintTime( 1, "Setting up DSD information", Abc_Clock() - clk );
}